

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  long lVar49;
  long lVar50;
  unsigned_long uVar51;
  long lVar52;
  ulong uVar53;
  undefined4 uVar54;
  long lVar55;
  ulong uVar56;
  long lVar57;
  long lVar58;
  ulong uVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar70;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar69;
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  undefined1 auVar73 [16];
  float fVar76;
  undefined1 auVar74 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar89;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar90;
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  float fVar96;
  undefined1 auVar95 [64];
  size_t local_2e0;
  size_t local_2d8;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 auVar75 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar53 = r->_begin;
  uVar51 = r->_end;
  if (uVar53 < uVar51) {
    auVar73._8_4_ = 0xff800000;
    auVar73._0_8_ = 0xff800000ff800000;
    auVar73._12_4_ = 0xff800000;
    auVar75 = ZEXT1664(auVar73);
    auVar61._8_4_ = 0x7f800000;
    auVar61._0_8_ = 0x7f8000007f800000;
    auVar61._12_4_ = 0x7f800000;
    auVar78 = ZEXT1664(auVar61);
    local_2e0 = 0;
    auVar80._8_4_ = 0x7fffffff;
    auVar80._0_8_ = 0x7fffffff7fffffff;
    auVar80._12_4_ = 0x7fffffff;
    auVar81._8_4_ = 0x5dccb9a2;
    auVar81._0_8_ = 0x5dccb9a25dccb9a2;
    auVar81._12_4_ = 0x5dccb9a2;
    auVar82._8_4_ = 0xddccb9a2;
    auVar82._0_8_ = 0xddccb9a2ddccb9a2;
    auVar82._12_4_ = 0xddccb9a2;
    auVar92 = ZEXT1664(auVar61);
    auVar72 = ZEXT1664(auVar73);
    local_2d8 = k;
    do {
      pBVar6 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               vertices.items;
      uVar5 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                  super_CurveGeometry.super_Geometry.field_0x58 +
                       *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68 * uVar53);
      uVar56 = (ulong)(uVar5 + 3);
      if (uVar56 < (pBVar6->super_RawBufferView).num) {
        lVar52 = 0;
        do {
          lVar57 = *(long *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar52);
          lVar58 = *(long *)((long)&(pBVar6->super_RawBufferView).stride + lVar52);
          lVar55 = lVar58 * (ulong)uVar5;
          lVar49 = lVar58 * (ulong)(uVar5 + 1);
          lVar50 = lVar58 * (ulong)(uVar5 + 2);
          auVar73 = vinsertps_avx(ZEXT416(*(uint *)(lVar57 + 0xc + lVar55)),
                                  ZEXT416(*(uint *)(lVar57 + 0xc + lVar49)),0x10);
          auVar73 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(lVar57 + 0xc + lVar50)),0x20);
          auVar73 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(lVar57 + 0xc + lVar58 * uVar56)),0x30);
          auVar73 = vandps_avx(auVar73,auVar80);
          auVar73 = vcmpps_avx(auVar73,auVar81,5);
          if ((((auVar73 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar73 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar73 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar73[0xf] < '\0') goto LAB_0123d7fd;
          auVar73 = *(undefined1 (*) [16])(lVar57 + lVar55);
          auVar61 = vcmpps_avx(auVar73,auVar82,6);
          auVar73 = vcmpps_avx(auVar73,auVar81,1);
          auVar73 = vandps_avx(auVar61,auVar73);
          uVar54 = vmovmskps_avx(auVar73);
          if ((~(byte)uVar54 & 7) != 0) goto LAB_0123d7fd;
          auVar73 = *(undefined1 (*) [16])(lVar57 + lVar49);
          auVar61 = vcmpps_avx(auVar73,auVar82,6);
          auVar73 = vcmpps_avx(auVar73,auVar81,1);
          auVar73 = vandps_avx(auVar61,auVar73);
          uVar54 = vmovmskps_avx(auVar73);
          if ((~(byte)uVar54 & 7) != 0) goto LAB_0123d7fd;
          auVar73 = *(undefined1 (*) [16])(lVar57 + lVar50);
          auVar61 = vcmpps_avx(auVar73,auVar82,6);
          auVar73 = vcmpps_avx(auVar73,auVar81,1);
          auVar73 = vandps_avx(auVar61,auVar73);
          uVar54 = vmovmskps_avx(auVar73);
          if ((~(byte)uVar54 & 7) != 0) goto LAB_0123d7fd;
          auVar73 = *(undefined1 (*) [16])(lVar57 + lVar58 * uVar56);
          auVar61 = vcmpps_avx(auVar73,auVar82,6);
          auVar73 = vcmpps_avx(auVar73,auVar81,1);
          auVar73 = vandps_avx(auVar61,auVar73);
          uVar54 = vmovmskps_avx(auVar73);
          if ((~(byte)uVar54 & 7) != 0) goto LAB_0123d7fd;
          lVar52 = lVar52 + 0x38;
        } while ((ulong)((this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                         super_CurveGeometry.super_Geometry.numTimeSteps - 1) * 0x38 + 0x38 !=
                 lVar52);
        pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
        sVar8 = (pBVar6->super_RawBufferView).stride;
        lVar52 = uVar5 * sVar8;
        auVar73 = *(undefined1 (*) [16])(pcVar7 + lVar52);
        lVar57 = (uVar5 + 1) * sVar8;
        auVar61 = *(undefined1 (*) [16])(pcVar7 + lVar57);
        lVar58 = (uVar5 + 2) * sVar8;
        auVar62 = *(undefined1 (*) [16])(pcVar7 + lVar58);
        auVar84 = *(undefined1 (*) [16])(pcVar7 + uVar56 * sVar8);
        auVar95 = ZEXT1664(auVar84);
        fVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                maxRadiusScale;
        fVar11 = fVar4 * *(float *)(pcVar7 + lVar52 + 0xc);
        fVar12 = fVar4 * *(float *)(pcVar7 + lVar57 + 0xc);
        fVar13 = fVar4 * *(float *)(pcVar7 + lVar58 + 0xc);
        fVar4 = fVar4 * *(float *)(pcVar7 + uVar56 * sVar8 + 0xc);
        uVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                tessellationRate;
        uVar56 = (ulong)uVar5;
        auVar68 = auVar75._0_16_;
        auVar93 = ZEXT416((uint)fVar13);
        if (uVar56 == 4) {
          auVar15 = vshufps_avx(auVar84,auVar84,0);
          auVar16 = vshufps_avx(auVar84,auVar84,0x55);
          auVar60 = vshufps_avx(auVar84,auVar84,0xaa);
          auVar17 = vshufps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),0);
          auVar67 = vshufps_avx(auVar62,auVar62,0);
          auVar77 = vshufps_avx(auVar62,auVar62,0x55);
          auVar84 = vinsertps_avx(auVar62,ZEXT416((uint)fVar13),0x30);
          auVar62 = vshufps_avx(auVar62,auVar62,0xaa);
          auVar18 = vshufps_avx(ZEXT416((uint)fVar13),auVar93,0);
          auVar93 = vshufps_avx(auVar61,auVar61,0);
          auVar19 = vshufps_avx(auVar61,auVar61,0x55);
          auVar61 = vshufps_avx(auVar61,auVar61,0xaa);
          auVar20 = vshufps_avx(auVar73,auVar73,0);
          auVar21 = vshufps_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12),0);
          auVar22 = vshufps_avx(auVar73,auVar73,0x55);
          auVar73 = vshufps_avx(auVar73,auVar73,0xaa);
          auVar23 = vshufps_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11),0);
          auVar64._0_4_ =
               auVar20._0_4_ * (float)catmullrom_basis0._272_4_ +
               auVar93._0_4_ * (float)catmullrom_basis0._1428_4_ +
               auVar67._0_4_ * (float)catmullrom_basis0._2584_4_ +
               auVar15._0_4_ * (float)catmullrom_basis0._3740_4_;
          auVar64._4_4_ =
               auVar20._4_4_ * (float)catmullrom_basis0._276_4_ +
               auVar93._4_4_ * (float)catmullrom_basis0._1432_4_ +
               auVar67._4_4_ * (float)catmullrom_basis0._2588_4_ +
               auVar15._4_4_ * (float)catmullrom_basis0._3744_4_;
          auVar64._8_4_ =
               auVar20._8_4_ * (float)catmullrom_basis0._280_4_ +
               auVar93._8_4_ * (float)catmullrom_basis0._1436_4_ +
               auVar67._8_4_ * (float)catmullrom_basis0._2592_4_ +
               auVar15._8_4_ * (float)catmullrom_basis0._3748_4_;
          auVar64._12_4_ =
               auVar20._12_4_ * (float)catmullrom_basis0._284_4_ +
               auVar93._12_4_ * (float)catmullrom_basis0._1440_4_ +
               auVar67._12_4_ * (float)catmullrom_basis0._2596_4_ +
               auVar15._12_4_ * (float)catmullrom_basis0._3752_4_;
          auVar67._0_4_ =
               auVar22._0_4_ * (float)catmullrom_basis0._272_4_ +
               auVar19._0_4_ * (float)catmullrom_basis0._1428_4_ +
               auVar77._0_4_ * (float)catmullrom_basis0._2584_4_ +
               auVar16._0_4_ * (float)catmullrom_basis0._3740_4_;
          auVar67._4_4_ =
               auVar22._4_4_ * (float)catmullrom_basis0._276_4_ +
               auVar19._4_4_ * (float)catmullrom_basis0._1432_4_ +
               auVar77._4_4_ * (float)catmullrom_basis0._2588_4_ +
               auVar16._4_4_ * (float)catmullrom_basis0._3744_4_;
          auVar67._8_4_ =
               auVar22._8_4_ * (float)catmullrom_basis0._280_4_ +
               auVar19._8_4_ * (float)catmullrom_basis0._1436_4_ +
               auVar77._8_4_ * (float)catmullrom_basis0._2592_4_ +
               auVar16._8_4_ * (float)catmullrom_basis0._3748_4_;
          auVar67._12_4_ =
               auVar22._12_4_ * (float)catmullrom_basis0._284_4_ +
               auVar19._12_4_ * (float)catmullrom_basis0._1440_4_ +
               auVar77._12_4_ * (float)catmullrom_basis0._2596_4_ +
               auVar16._12_4_ * (float)catmullrom_basis0._3752_4_;
          auVar77._0_4_ =
               auVar61._0_4_ * (float)catmullrom_basis0._1428_4_ +
               auVar62._0_4_ * (float)catmullrom_basis0._2584_4_ +
               auVar60._0_4_ * (float)catmullrom_basis0._3740_4_ +
               auVar73._0_4_ * (float)catmullrom_basis0._272_4_;
          auVar77._4_4_ =
               auVar61._4_4_ * (float)catmullrom_basis0._1432_4_ +
               auVar62._4_4_ * (float)catmullrom_basis0._2588_4_ +
               auVar60._4_4_ * (float)catmullrom_basis0._3744_4_ +
               auVar73._4_4_ * (float)catmullrom_basis0._276_4_;
          auVar77._8_4_ =
               auVar61._8_4_ * (float)catmullrom_basis0._1436_4_ +
               auVar62._8_4_ * (float)catmullrom_basis0._2592_4_ +
               auVar60._8_4_ * (float)catmullrom_basis0._3748_4_ +
               auVar73._8_4_ * (float)catmullrom_basis0._280_4_;
          auVar77._12_4_ =
               auVar61._12_4_ * (float)catmullrom_basis0._1440_4_ +
               auVar62._12_4_ * (float)catmullrom_basis0._2596_4_ +
               auVar60._12_4_ * (float)catmullrom_basis0._3752_4_ +
               auVar73._12_4_ * (float)catmullrom_basis0._284_4_;
          auVar60._0_4_ =
               auVar23._0_4_ * (float)catmullrom_basis0._272_4_ +
               auVar21._0_4_ * (float)catmullrom_basis0._1428_4_ +
               auVar18._0_4_ * (float)catmullrom_basis0._2584_4_ +
               auVar17._0_4_ * (float)catmullrom_basis0._3740_4_;
          auVar60._4_4_ =
               auVar23._4_4_ * (float)catmullrom_basis0._276_4_ +
               auVar21._4_4_ * (float)catmullrom_basis0._1432_4_ +
               auVar18._4_4_ * (float)catmullrom_basis0._2588_4_ +
               auVar17._4_4_ * (float)catmullrom_basis0._3744_4_;
          auVar60._8_4_ =
               auVar23._8_4_ * (float)catmullrom_basis0._280_4_ +
               auVar21._8_4_ * (float)catmullrom_basis0._1436_4_ +
               auVar18._8_4_ * (float)catmullrom_basis0._2592_4_ +
               auVar17._8_4_ * (float)catmullrom_basis0._3748_4_;
          auVar60._12_4_ =
               auVar23._12_4_ * (float)catmullrom_basis0._284_4_ +
               auVar21._12_4_ * (float)catmullrom_basis0._1440_4_ +
               auVar18._12_4_ * (float)catmullrom_basis0._2596_4_ +
               auVar17._12_4_ * (float)catmullrom_basis0._3752_4_;
          auVar93 = vshufps_avx(auVar64,auVar64,0xb1);
          auVar73 = vminps_avx(auVar93,auVar64);
          auVar61 = vshufpd_avx(auVar73,auVar73,1);
          auVar73 = vminps_avx(auVar61,auVar73);
          auVar15 = vshufps_avx(auVar67,auVar67,0xb1);
          auVar61 = vminps_avx(auVar15,auVar67);
          auVar62 = vshufpd_avx(auVar61,auVar61,1);
          auVar61 = vminps_avx(auVar62,auVar61);
          auVar73 = vinsertps_avx(auVar73,auVar61,0x1c);
          auVar16 = vshufps_avx(auVar77,auVar77,0xb1);
          auVar61 = vminps_avx(auVar16,auVar77);
          auVar62 = vshufpd_avx(auVar61,auVar61,1);
          auVar61 = vminps_avx(auVar62,auVar61);
          auVar61 = vinsertps_avx(auVar73,auVar61,0x20);
          auVar73 = vmaxps_avx(auVar93,auVar64);
          auVar62 = vshufpd_avx(auVar73,auVar73,1);
          auVar73 = vmaxps_avx(auVar62,auVar73);
          auVar62 = vmaxps_avx(auVar15,auVar67);
          auVar93 = vshufpd_avx(auVar62,auVar62,1);
          auVar62 = vmaxps_avx(auVar93,auVar62);
          auVar73 = vinsertps_avx(auVar73,auVar62,0x1c);
          auVar62 = vmaxps_avx(auVar16,auVar77);
          auVar93 = vshufpd_avx(auVar62,auVar62,1);
          auVar62 = vmaxps_avx(auVar93,auVar62);
          auVar62 = vinsertps_avx(auVar73,auVar62,0x20);
          auVar73 = vandps_avx(auVar60,auVar80);
          auVar93 = vshufps_avx(auVar73,auVar73,0xb1);
          auVar73 = vmaxps_avx(auVar93,auVar73);
          auVar93 = vshufps_avx(auVar73,auVar73,0);
          auVar73 = vshufps_avx(auVar73,auVar73,0xaa);
          auVar93 = vmaxps_avx(auVar73,auVar93);
          auVar15 = vminps_avx(auVar61,auVar84);
          auVar61 = vmaxps_avx(auVar62,auVar84);
          auVar73 = vandps_avx(auVar18,auVar80);
          auVar62 = vmaxps_avx(auVar93,auVar73);
          auVar73 = vsubps_avx(auVar15,auVar62);
          auVar84._0_4_ = auVar61._0_4_ + auVar62._0_4_;
          auVar84._4_4_ = auVar61._4_4_ + auVar62._4_4_;
          auVar84._8_4_ = auVar61._8_4_ + auVar62._8_4_;
          auVar84._12_4_ = auVar61._12_4_ + auVar62._12_4_;
        }
        else {
          if ((int)uVar5 < 0) {
            auVar66 = ZEXT832(0);
            auVar87._8_4_ = 0xff800000;
            auVar87._0_8_ = 0xff800000ff800000;
            auVar87._12_4_ = 0xff800000;
            auVar87._16_4_ = 0xff800000;
            auVar87._20_4_ = 0xff800000;
            auVar87._24_4_ = 0xff800000;
            auVar87._28_4_ = 0xff800000;
            auVar88._8_4_ = 0x7f800000;
            auVar88._0_8_ = 0x7f8000007f800000;
            auVar88._12_4_ = 0x7f800000;
            auVar88._16_4_ = 0x7f800000;
            auVar88._20_4_ = 0x7f800000;
            auVar88._24_4_ = 0x7f800000;
            auVar88._28_4_ = 0x7f800000;
            auVar94 = auVar88;
            auVar85 = auVar87;
            auVar91 = auVar88;
            auVar86 = auVar87;
          }
          else {
            auVar15 = vpshufd_avx(ZEXT416(uVar5),0);
            auVar16 = vshufps_avx(auVar73,auVar73,0);
            auVar60 = vshufps_avx(auVar73,auVar73,0x55);
            auVar73 = vshufps_avx(auVar73,auVar73,0xaa);
            auVar17 = vshufps_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11),0);
            auVar67 = vshufps_avx(auVar61,auVar61,0);
            auVar77 = vshufps_avx(auVar61,auVar61,0x55);
            auVar61 = vshufps_avx(auVar61,auVar61,0xaa);
            auVar18 = vshufps_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12),0);
            auVar19 = vshufps_avx(auVar62,auVar62,0);
            auVar20 = vshufps_avx(auVar62,auVar62,0x55);
            auVar62 = vshufps_avx(auVar62,auVar62,0xaa);
            auVar93 = vshufps_avx(auVar93,auVar93,0);
            auVar21 = vshufps_avx(auVar84,auVar84,0);
            auVar22 = vshufps_avx(auVar84,auVar84,0x55);
            auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
            auVar23 = vshufps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),0);
            lVar52 = uVar56 * 0x44;
            uVar59 = 0;
            auVar79 = ZEXT864(0);
            auVar94._8_4_ = 0x7f800000;
            auVar94._0_8_ = 0x7f8000007f800000;
            auVar94._12_4_ = 0x7f800000;
            auVar94._16_4_ = 0x7f800000;
            auVar94._20_4_ = 0x7f800000;
            auVar94._24_4_ = 0x7f800000;
            auVar94._28_4_ = 0x7f800000;
            auVar85._8_4_ = 0xff800000;
            auVar85._0_8_ = 0xff800000ff800000;
            auVar85._12_4_ = 0xff800000;
            auVar85._16_4_ = 0xff800000;
            auVar85._20_4_ = 0xff800000;
            auVar85._24_4_ = 0xff800000;
            auVar85._28_4_ = 0xff800000;
            auVar88 = auVar94;
            auVar87 = auVar85;
            auVar91 = auVar94;
            auVar86 = auVar85;
            do {
              auVar14 = vpshufd_avx(ZEXT416((uint)uVar59),0);
              auVar64 = vpor_avx(auVar14,_DAT_01f7fcf0);
              auVar14 = vpor_avx(auVar14,_DAT_01fafea0);
              auVar64 = vpcmpgtd_avx(auVar64,auVar15);
              auVar14 = vpcmpgtd_avx(auVar14,auVar15);
              auVar83._16_16_ = auVar14;
              auVar83._0_16_ = auVar64;
              pfVar1 = (float *)(lVar52 + 0x21b3c74 + uVar59 * 4);
              fVar4 = *pfVar1;
              fVar11 = pfVar1[1];
              fVar12 = pfVar1[2];
              fVar13 = pfVar1[3];
              fVar24 = pfVar1[4];
              fVar25 = pfVar1[5];
              fVar26 = pfVar1[6];
              pfVar2 = (float *)(lVar52 + 0x21b40f8 + uVar59 * 4);
              fVar27 = *pfVar2;
              fVar28 = pfVar2[1];
              fVar29 = pfVar2[2];
              fVar30 = pfVar2[3];
              fVar31 = pfVar2[4];
              fVar32 = pfVar2[5];
              fVar33 = pfVar2[6];
              local_1f8 = auVar21._0_4_;
              fStack_1f4 = auVar21._4_4_;
              fStack_1f0 = auVar21._8_4_;
              fStack_1ec = auVar21._12_4_;
              local_218 = auVar22._0_4_;
              fStack_214 = auVar22._4_4_;
              fStack_210 = auVar22._8_4_;
              fStack_20c = auVar22._12_4_;
              local_238 = auVar84._0_4_;
              fStack_234 = auVar84._4_4_;
              fStack_230 = auVar84._8_4_;
              fStack_22c = auVar84._12_4_;
              local_178 = auVar19._0_4_;
              fStack_174 = auVar19._4_4_;
              fStack_170 = auVar19._8_4_;
              fStack_16c = auVar19._12_4_;
              fVar96 = auVar95._28_4_;
              local_198 = auVar20._0_4_;
              fStack_194 = auVar20._4_4_;
              fStack_190 = auVar20._8_4_;
              fStack_18c = auVar20._12_4_;
              fVar76 = fVar96 + auVar75._28_4_;
              local_1b8 = auVar62._0_4_;
              fStack_1b4 = auVar62._4_4_;
              fStack_1b0 = auVar62._8_4_;
              fStack_1ac = auVar62._12_4_;
              pfVar3 = (float *)(lVar52 + 0x21b37f0 + uVar59 * 4);
              fVar34 = *pfVar3;
              fVar35 = pfVar3[1];
              fVar36 = pfVar3[2];
              fVar37 = pfVar3[3];
              fVar38 = pfVar3[4];
              fVar39 = pfVar3[5];
              fVar40 = pfVar3[6];
              fVar41 = pfVar3[7];
              local_258 = auVar23._0_4_;
              fStack_254 = auVar23._4_4_;
              fStack_250 = auVar23._8_4_;
              fStack_24c = auVar23._12_4_;
              local_1d8 = auVar93._0_4_;
              fStack_1d4 = auVar93._4_4_;
              fStack_1d0 = auVar93._8_4_;
              fStack_1cc = auVar93._12_4_;
              local_f8 = auVar67._0_4_;
              fStack_f4 = auVar67._4_4_;
              fStack_f0 = auVar67._8_4_;
              fStack_ec = auVar67._12_4_;
              local_118 = auVar77._0_4_;
              fStack_114 = auVar77._4_4_;
              fStack_110 = auVar77._8_4_;
              fStack_10c = auVar77._12_4_;
              local_138 = auVar61._0_4_;
              fStack_134 = auVar61._4_4_;
              fStack_130 = auVar61._8_4_;
              fStack_12c = auVar61._12_4_;
              pfVar3 = (float *)(catmullrom_basis0 + uVar59 * 4 + lVar52);
              fVar42 = *pfVar3;
              fVar43 = pfVar3[1];
              fVar44 = pfVar3[2];
              fVar45 = pfVar3[3];
              fVar46 = pfVar3[4];
              fVar47 = pfVar3[5];
              fVar48 = pfVar3[6];
              local_158 = auVar18._0_4_;
              fStack_154 = auVar18._4_4_;
              fStack_150 = auVar18._8_4_;
              fStack_14c = auVar18._12_4_;
              local_78 = auVar16._0_4_;
              fStack_74 = auVar16._4_4_;
              fStack_70 = auVar16._8_4_;
              fStack_6c = auVar16._12_4_;
              auVar65._0_4_ =
                   fVar42 * local_78 + fVar34 * local_f8 + fVar4 * local_178 + fVar27 * local_1f8;
              auVar65._4_4_ =
                   fVar43 * fStack_74 +
                   fVar35 * fStack_f4 + fVar11 * fStack_174 + fVar28 * fStack_1f4;
              auVar65._8_4_ =
                   fVar44 * fStack_70 +
                   fVar36 * fStack_f0 + fVar12 * fStack_170 + fVar29 * fStack_1f0;
              auVar65._12_4_ =
                   fVar45 * fStack_6c +
                   fVar37 * fStack_ec + fVar13 * fStack_16c + fVar30 * fStack_1ec;
              auVar65._16_4_ =
                   fVar46 * local_78 + fVar38 * local_f8 + fVar24 * local_178 + fVar31 * local_1f8;
              auVar65._20_4_ =
                   fVar47 * fStack_74 +
                   fVar39 * fStack_f4 + fVar25 * fStack_174 + fVar32 * fStack_1f4;
              auVar65._24_4_ =
                   fVar48 * fStack_70 +
                   fVar40 * fStack_f0 + fVar26 * fStack_170 + fVar33 * fStack_1f0;
              auVar65._28_4_ = fVar41 + pfVar2[7] + fVar96 + 0.0;
              local_98 = auVar60._0_4_;
              fStack_94 = auVar60._4_4_;
              fStack_90 = auVar60._8_4_;
              fStack_8c = auVar60._12_4_;
              auVar71._0_4_ =
                   fVar42 * local_98 + fVar34 * local_118 + fVar4 * local_198 + fVar27 * local_218;
              auVar71._4_4_ =
                   fVar43 * fStack_94 +
                   fVar35 * fStack_114 + fVar11 * fStack_194 + fVar28 * fStack_214;
              auVar71._8_4_ =
                   fVar44 * fStack_90 +
                   fVar36 * fStack_110 + fVar12 * fStack_190 + fVar29 * fStack_210;
              auVar71._12_4_ =
                   fVar45 * fStack_8c +
                   fVar37 * fStack_10c + fVar13 * fStack_18c + fVar30 * fStack_20c;
              auVar71._16_4_ =
                   fVar46 * local_98 + fVar38 * local_118 + fVar24 * local_198 + fVar31 * local_218;
              auVar71._20_4_ =
                   fVar47 * fStack_94 +
                   fVar39 * fStack_114 + fVar25 * fStack_194 + fVar32 * fStack_214;
              auVar71._24_4_ =
                   fVar48 * fStack_90 +
                   fVar40 * fStack_110 + fVar26 * fStack_190 + fVar33 * fStack_210;
              auVar71._28_4_ = fVar41 + fVar96 + 0.0 + fVar76;
              auVar66 = vminps_avx(auVar88,auVar65);
              auVar88 = vblendvps_avx(auVar66,auVar88,auVar83);
              local_b8 = auVar73._0_4_;
              fStack_b4 = auVar73._4_4_;
              fStack_b0 = auVar73._8_4_;
              fStack_ac = auVar73._12_4_;
              auVar74._0_4_ =
                   fVar42 * local_b8 + fVar34 * local_138 + fVar4 * local_1b8 + fVar27 * local_238;
              auVar74._4_4_ =
                   fVar43 * fStack_b4 +
                   fVar35 * fStack_134 + fVar11 * fStack_1b4 + fVar28 * fStack_234;
              auVar74._8_4_ =
                   fVar44 * fStack_b0 +
                   fVar36 * fStack_130 + fVar12 * fStack_1b0 + fVar29 * fStack_230;
              auVar74._12_4_ =
                   fVar45 * fStack_ac +
                   fVar37 * fStack_12c + fVar13 * fStack_1ac + fVar30 * fStack_22c;
              auVar74._16_4_ =
                   fVar46 * local_b8 + fVar38 * local_138 + fVar24 * local_1b8 + fVar31 * local_238;
              auVar74._20_4_ =
                   fVar47 * fStack_b4 +
                   fVar39 * fStack_134 + fVar25 * fStack_1b4 + fVar32 * fStack_234;
              auVar74._24_4_ =
                   fVar48 * fStack_b0 +
                   fVar40 * fStack_130 + fVar26 * fStack_1b0 + fVar33 * fStack_230;
              auVar74._28_4_ = auVar66._28_4_ + fVar76 + fVar96 + auVar79._28_4_;
              auVar75 = ZEXT3264(auVar74);
              auVar66 = vminps_avx(auVar91,auVar71);
              auVar91 = vblendvps_avx(auVar66,auVar91,auVar83);
              auVar66 = vminps_avx(auVar94,auVar74);
              auVar95 = ZEXT3264(auVar66);
              auVar94 = vblendvps_avx(auVar66,auVar94,auVar83);
              local_d8 = auVar17._0_4_;
              fStack_d4 = auVar17._4_4_;
              fStack_d0 = auVar17._8_4_;
              fStack_cc = auVar17._12_4_;
              auVar63._0_4_ =
                   fVar42 * local_d8 + fVar34 * local_158 + fVar4 * local_1d8 + fVar27 * local_258;
              auVar63._4_4_ =
                   fVar43 * fStack_d4 +
                   fVar35 * fStack_154 + fVar11 * fStack_1d4 + fVar28 * fStack_254;
              auVar63._8_4_ =
                   fVar44 * fStack_d0 +
                   fVar36 * fStack_150 + fVar12 * fStack_1d0 + fVar29 * fStack_250;
              auVar63._12_4_ =
                   fVar45 * fStack_cc +
                   fVar37 * fStack_14c + fVar13 * fStack_1cc + fVar30 * fStack_24c;
              auVar63._16_4_ =
                   fVar46 * local_d8 + fVar38 * local_158 + fVar24 * local_1d8 + fVar31 * local_258;
              auVar63._20_4_ =
                   fVar47 * fStack_d4 +
                   fVar39 * fStack_154 + fVar25 * fStack_1d4 + fVar32 * fStack_254;
              auVar63._24_4_ =
                   fVar48 * fStack_d0 +
                   fVar40 * fStack_150 + fVar26 * fStack_1d0 + fVar33 * fStack_250;
              auVar63._28_4_ = pfVar3[7] + fVar41 + pfVar1[7] + pfVar2[7];
              auVar66 = vmaxps_avx(auVar86,auVar65);
              auVar86 = vblendvps_avx(auVar66,auVar86,auVar83);
              auVar66 = vmaxps_avx(auVar87,auVar71);
              auVar87 = vblendvps_avx(auVar66,auVar87,auVar83);
              auVar66 = vmaxps_avx(auVar85,auVar74);
              auVar85 = vblendvps_avx(auVar66,auVar85,auVar83);
              auVar66._8_4_ = 0x7fffffff;
              auVar66._0_8_ = 0x7fffffff7fffffff;
              auVar66._12_4_ = 0x7fffffff;
              auVar66._16_4_ = 0x7fffffff;
              auVar66._20_4_ = 0x7fffffff;
              auVar66._24_4_ = 0x7fffffff;
              auVar66._28_4_ = 0x7fffffff;
              auVar66 = vandps_avx(auVar63,auVar66);
              auVar66 = vmaxps_avx(auVar79._0_32_,auVar66);
              auVar66 = vblendvps_avx(auVar66,auVar79._0_32_,auVar83);
              auVar79 = ZEXT3264(auVar66);
              uVar59 = uVar59 + 8;
            } while (uVar59 <= uVar56);
          }
          auVar63 = vshufps_avx(auVar88,auVar88,0xb1);
          auVar88 = vminps_avx(auVar88,auVar63);
          auVar63 = vshufpd_avx(auVar88,auVar88,5);
          auVar88 = vminps_avx(auVar88,auVar63);
          auVar73 = vminps_avx(auVar88._0_16_,auVar88._16_16_);
          auVar88 = vshufps_avx(auVar91,auVar91,0xb1);
          auVar88 = vminps_avx(auVar91,auVar88);
          auVar91 = vshufpd_avx(auVar88,auVar88,5);
          auVar88 = vminps_avx(auVar88,auVar91);
          auVar61 = vminps_avx(auVar88._0_16_,auVar88._16_16_);
          auVar61 = vunpcklps_avx(auVar73,auVar61);
          auVar88 = vshufps_avx(auVar94,auVar94,0xb1);
          auVar88 = vminps_avx(auVar94,auVar88);
          auVar91 = vshufpd_avx(auVar88,auVar88,5);
          auVar88 = vminps_avx(auVar88,auVar91);
          auVar73 = vminps_avx(auVar88._0_16_,auVar88._16_16_);
          auVar73 = vinsertps_avx(auVar61,auVar73,0x28);
          auVar88 = vshufps_avx(auVar86,auVar86,0xb1);
          auVar88 = vmaxps_avx(auVar86,auVar88);
          auVar91 = vshufpd_avx(auVar88,auVar88,5);
          auVar88 = vmaxps_avx(auVar88,auVar91);
          auVar61 = vmaxps_avx(auVar88._0_16_,auVar88._16_16_);
          auVar88 = vshufps_avx(auVar87,auVar87,0xb1);
          auVar88 = vmaxps_avx(auVar87,auVar88);
          auVar91 = vshufpd_avx(auVar88,auVar88,5);
          auVar88 = vmaxps_avx(auVar88,auVar91);
          auVar62 = vmaxps_avx(auVar88._0_16_,auVar88._16_16_);
          auVar62 = vunpcklps_avx(auVar61,auVar62);
          auVar88 = vshufps_avx(auVar85,auVar85,0xb1);
          auVar88 = vmaxps_avx(auVar85,auVar88);
          auVar91 = vshufpd_avx(auVar88,auVar88,5);
          auVar88 = vmaxps_avx(auVar88,auVar91);
          auVar61 = vmaxps_avx(auVar88._0_16_,auVar88._16_16_);
          auVar61 = vinsertps_avx(auVar62,auVar61,0x28);
          auVar88 = vshufps_avx(auVar66,auVar66,0xb1);
          auVar88 = vmaxps_avx(auVar66,auVar88);
          auVar91 = vshufpd_avx(auVar88,auVar88,5);
          auVar88 = vmaxps_avx(auVar88,auVar91);
          auVar62 = vmaxps_avx(auVar88._0_16_,auVar88._16_16_);
          auVar62 = vshufps_avx(auVar62,auVar62,0);
          auVar73 = vsubps_avx(auVar73,auVar62);
          auVar84._0_4_ = auVar61._0_4_ + auVar62._0_4_;
          auVar84._4_4_ = auVar61._4_4_ + auVar62._4_4_;
          auVar84._8_4_ = auVar61._8_4_ + auVar62._8_4_;
          auVar84._12_4_ = auVar61._12_4_ + auVar62._12_4_;
        }
        auVar61 = vandps_avx(auVar73,auVar80);
        auVar62 = vandps_avx(auVar84,auVar80);
        auVar61 = vmaxps_avx(auVar61,auVar62);
        auVar62 = vmovshdup_avx(auVar61);
        auVar62 = vmaxss_avx(auVar62,auVar61);
        auVar61 = vshufpd_avx(auVar61,auVar61,1);
        auVar61 = vmaxss_avx(auVar61,auVar62);
        auVar61 = ZEXT416((uint)(auVar61._0_4_ * 4.7683716e-07));
        auVar61 = vshufps_avx(auVar61,auVar61,0);
        auVar73 = vsubps_avx(auVar73,auVar61);
        aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar73,ZEXT416(geomID),0x30);
        auVar62._0_4_ = auVar84._0_4_ + auVar61._0_4_;
        auVar62._4_4_ = auVar84._4_4_ + auVar61._4_4_;
        auVar62._8_4_ = auVar84._8_4_ + auVar61._8_4_;
        auVar62._12_4_ = auVar84._12_4_ + auVar61._12_4_;
        aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar62,ZEXT416((uint)uVar53),0x30);
        auVar73 = vminps_avx(auVar78._0_16_,(undefined1  [16])aVar9);
        auVar78 = ZEXT1664(auVar73);
        auVar73 = vmaxps_avx(auVar68,(undefined1  [16])aVar10);
        auVar75 = ZEXT1664(auVar73);
        auVar68._0_4_ = aVar9.x + aVar10.x;
        auVar68._4_4_ = aVar9.y + aVar10.y;
        auVar68._8_4_ = aVar9.z + aVar10.z;
        auVar68._12_4_ = aVar9.field_3.w + aVar10.field_3.w;
        auVar73 = vminps_avx(auVar92._0_16_,auVar68);
        auVar92 = ZEXT1664(auVar73);
        auVar73 = vmaxps_avx(auVar72._0_16_,auVar68);
        auVar72 = ZEXT1664(auVar73);
        local_2e0 = local_2e0 + 1;
        prims[local_2d8].upper.field_0.field_1 = aVar10;
        prims[local_2d8].lower.field_0.field_1 = aVar9;
        uVar51 = r->_end;
        local_2d8 = local_2d8 + 1;
      }
LAB_0123d7fd:
      aVar69 = auVar72._0_16_;
      aVar89 = auVar92._0_16_;
      aVar70 = auVar75._0_16_;
      aVar90 = auVar78._0_16_;
      uVar53 = uVar53 + 1;
    } while (uVar53 < uVar51);
  }
  else {
    aVar90.m128[2] = INFINITY;
    aVar90._0_8_ = 0x7f8000007f800000;
    aVar90.m128[3] = INFINITY;
    aVar70.m128[2] = -INFINITY;
    aVar70._0_8_ = 0xff800000ff800000;
    aVar70.m128[3] = -INFINITY;
    local_2e0 = 0;
    aVar89 = aVar90;
    aVar69 = aVar70;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar90;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar70;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar89;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar69;
  __return_storage_ptr__->end = local_2e0;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }